

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_ldrddi.cpp
# Opt level: O0

ze_result_t
loader::zeCommandListAppendWaitExternalSemaphoreExt
          (ze_command_list_handle_t hCommandList,uint32_t numSemaphores,
          ze_external_semaphore_ext_handle_t *phSemaphores,
          ze_external_semaphore_wait_params_ext_t *waitParams,ze_event_handle_t hSignalEvent,
          uint32_t numWaitEvents,ze_event_handle_t *phWaitEvents)

{
  code *pcVar1;
  undefined8 uVar2;
  ulong uVar3;
  void *pvVar4;
  void *pvVar5;
  undefined8 local_80;
  ulong local_70;
  size_t i_1;
  ze_event_handle_t *phWaitEventsLocal;
  size_t i;
  ze_external_semaphore_ext_handle_t *phSemaphoresLocal;
  ze_pfnCommandListAppendWaitExternalSemaphoreExt_t pfnAppendWaitExternalSemaphoreExt;
  dditable_t *dditable;
  ze_result_t result;
  uint32_t numWaitEvents_local;
  ze_event_handle_t hSignalEvent_local;
  ze_external_semaphore_wait_params_ext_t *waitParams_local;
  ze_external_semaphore_ext_handle_t *phSemaphores_local;
  uint32_t numSemaphores_local;
  ze_command_list_handle_t hCommandList_local;
  
  pcVar1 = *(code **)(*(long *)(hCommandList + 8) + 0x328);
  if (pcVar1 == (code *)0x0) {
    hCommandList_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  else {
    uVar2 = *(undefined8 *)hCommandList;
    uVar3 = SUB168(ZEXT416(numSemaphores) * ZEXT816(8),0);
    if (SUB168(ZEXT416(numSemaphores) * ZEXT816(8),8) != 0) {
      uVar3 = 0xffffffffffffffff;
    }
    pvVar4 = operator_new__(uVar3);
    for (phWaitEventsLocal = (ze_event_handle_t *)0x0;
        phSemaphores != (ze_external_semaphore_ext_handle_t *)0x0 &&
        phWaitEventsLocal < (ze_event_handle_t *)(ulong)numSemaphores;
        phWaitEventsLocal = (ze_event_handle_t *)((long)phWaitEventsLocal + 1)) {
      *(undefined8 *)((long)pvVar4 + (long)phWaitEventsLocal * 8) =
           *(undefined8 *)phSemaphores[(long)phWaitEventsLocal];
    }
    if (hSignalEvent == (ze_event_handle_t)0x0) {
      local_80 = 0;
    }
    else {
      local_80 = *(undefined8 *)hSignalEvent;
    }
    uVar3 = SUB168(ZEXT416(numWaitEvents) * ZEXT816(8),0);
    if (SUB168(ZEXT416(numWaitEvents) * ZEXT816(8),8) != 0) {
      uVar3 = 0xffffffffffffffff;
    }
    pvVar5 = operator_new__(uVar3);
    for (local_70 = 0; phWaitEvents != (ze_event_handle_t *)0x0 && local_70 < numWaitEvents;
        local_70 = local_70 + 1) {
      *(undefined8 *)((long)pvVar5 + local_70 * 8) = *(undefined8 *)phWaitEvents[local_70];
    }
    hCommandList_local._4_4_ =
         (*pcVar1)(uVar2,numSemaphores,pvVar4,waitParams,local_80,numWaitEvents,pvVar5);
    if (pvVar4 != (void *)0x0) {
      operator_delete__(pvVar4);
    }
    if (pvVar5 != (void *)0x0) {
      operator_delete__(pvVar5);
    }
  }
  return hCommandList_local._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeCommandListAppendWaitExternalSemaphoreExt(
        ze_command_list_handle_t hCommandList,          ///< [in] The command list handle.
        uint32_t numSemaphores,                         ///< [in] The number of external semaphores.
        ze_external_semaphore_ext_handle_t* phSemaphores,   ///< [in] [range(0,numSemaphores)] The vector of external semaphore handles
                                                        ///< to append into command list.
        ze_external_semaphore_wait_params_ext_t* waitParams,///< [in] Wait parameters.
        ze_event_handle_t hSignalEvent,                 ///< [in][optional] handle of the event to signal on completion
        uint32_t numWaitEvents,                         ///< [in][optional] number of events to wait on before launching; must be 0
                                                        ///< if `nullptr == phWaitEvents`
        ze_event_handle_t* phWaitEvents                 ///< [in][optional][range(0, numWaitEvents)] handle of the events to wait
                                                        ///< on before launching
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // extract driver's function pointer table
        auto dditable = reinterpret_cast<ze_command_list_object_t*>( hCommandList )->dditable;
        auto pfnAppendWaitExternalSemaphoreExt = dditable->ze.CommandList.pfnAppendWaitExternalSemaphoreExt;
        if( nullptr == pfnAppendWaitExternalSemaphoreExt )
            return ZE_RESULT_ERROR_UNINITIALIZED;

        // convert loader handle to driver handle
        hCommandList = reinterpret_cast<ze_command_list_object_t*>( hCommandList )->handle;

        // convert loader handles to driver handles
        auto phSemaphoresLocal = new ze_external_semaphore_ext_handle_t [numSemaphores];
        for( size_t i = 0; ( nullptr != phSemaphores ) && ( i < numSemaphores ); ++i )
            phSemaphoresLocal[ i ] = reinterpret_cast<ze_external_semaphore_ext_object_t*>( phSemaphores[ i ] )->handle;

        // convert loader handle to driver handle
        hSignalEvent = ( hSignalEvent ) ? reinterpret_cast<ze_event_object_t*>( hSignalEvent )->handle : nullptr;

        // convert loader handles to driver handles
        auto phWaitEventsLocal = new ze_event_handle_t [numWaitEvents];
        for( size_t i = 0; ( nullptr != phWaitEvents ) && ( i < numWaitEvents ); ++i )
            phWaitEventsLocal[ i ] = reinterpret_cast<ze_event_object_t*>( phWaitEvents[ i ] )->handle;

        // forward to device-driver
        result = pfnAppendWaitExternalSemaphoreExt( hCommandList, numSemaphores, phSemaphoresLocal, waitParams, hSignalEvent, numWaitEvents, phWaitEventsLocal );
        delete []phSemaphoresLocal;
        delete []phWaitEventsLocal;

        return result;
    }